

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeSphere *a_sphere,
                 ON_RTreeSearchResultCallback *a_result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double r [6];
  
  uVar9 = (ulong)a_node->m_count;
  bVar4 = true;
  if (0 < (long)uVar9) {
    dVar1 = a_sphere->m_point[0];
    dVar2 = a_sphere->m_radius;
    pdVar7 = a_node->m_branch[0].m_rect.m_max + 2;
    uVar6 = 0xffffffffffffffff;
    dVar3 = dVar2;
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      if (((ON_RTreeBBox *)(pdVar7 + -5))->m_min[0] <= dVar1) {
        dVar14 = 0.0;
        if (pdVar7[-2] < dVar1) {
          dVar13 = dVar1 - pdVar7[-2];
          goto LAB_005b179b;
        }
LAB_005b17ab:
        dVar12 = a_sphere->m_point[1];
        dVar11 = dVar14;
        if (pdVar7[-4] <= dVar12) {
          dVar13 = 0.0;
          if (pdVar7[-1] < dVar12) {
            dVar13 = dVar12 - pdVar7[-1];
            if (dVar2 < dVar13) goto LAB_005b18bb;
            dVar12 = dVar13;
            if (dVar14 < dVar13) goto LAB_005b181b;
          }
LAB_005b1816:
          dVar11 = dVar13;
          dVar12 = dVar14;
        }
        else {
          dVar13 = pdVar7[-4] - dVar12;
          if (dVar2 < dVar13) goto LAB_005b18bb;
          dVar12 = dVar13;
          if (dVar13 <= dVar14) goto LAB_005b1816;
        }
LAB_005b181b:
        dVar13 = a_sphere->m_point[2];
        if (pdVar7[-3] <= dVar13) {
          dVar14 = 0.0;
          if (*pdVar7 < dVar13) {
            dVar13 = dVar13 - *pdVar7;
            if (dVar2 < dVar13) goto LAB_005b18bb;
            dVar14 = dVar13;
            if (dVar12 < dVar13) goto LAB_005b1887;
          }
LAB_005b1882:
          dVar13 = dVar12;
          dVar12 = dVar14;
        }
        else {
          dVar13 = pdVar7[-3] - dVar13;
          if (dVar2 < dVar13) goto LAB_005b18bb;
          dVar14 = dVar13;
          if (dVar13 <= dVar12) goto LAB_005b1882;
        }
LAB_005b1887:
        if (0.0 < dVar13) {
          dVar13 = SQRT((dVar12 / dVar13) * (dVar12 / dVar13) +
                        (dVar11 / dVar13) * (dVar11 / dVar13) + 1.0) * dVar13;
        }
      }
      else {
        dVar13 = ((ON_RTreeBBox *)(pdVar7 + -5))->m_min[0] - dVar1;
LAB_005b179b:
        dVar14 = dVar13;
        if (dVar13 <= dVar2) goto LAB_005b17ab;
      }
LAB_005b18bb:
      if (dVar13 <= dVar3) {
        uVar6 = uVar8;
      }
      uVar6 = uVar6 & 0xffffffff;
      r[uVar8] = dVar13;
      dVar3 = (double)((ulong)dVar3 & -(ulong)(dVar3 < dVar13) |
                      ~-(ulong)(dVar3 < dVar13) & (ulong)dVar13);
      pdVar7 = pdVar7 + 7;
    }
    if (-1 < (int)uVar6) {
      if (a_node->m_level < 1) {
        bVar4 = (*a_result->m_resultCallback)
                          (a_result->m_context,
                           (ON__INT_PTR)a_node->m_branch[uVar6 & 0xffffffff].field_1.m_child);
        if (bVar4) {
          paVar10 = &a_node->m_branch[0].field_1;
          uVar8 = 0;
          while( true ) {
            bVar4 = uVar9 == uVar8;
            if (bVar4) {
              return bVar4;
            }
            if ((((uVar6 & 0xffffffff) != uVar8) && (r[uVar8] <= a_sphere->m_radius)) &&
               (bVar5 = (*a_result->m_resultCallback)
                                  (a_result->m_context,(ON__INT_PTR)paVar10->m_child), !bVar5))
            break;
            uVar8 = uVar8 + 1;
            paVar10 = paVar10 + 7;
          }
          return bVar4;
        }
      }
      else {
        bVar4 = SearchHelper(a_node->m_branch[uVar6 & 0xffffffff].field_1.m_child,a_sphere,a_result)
        ;
        if (bVar4) {
          paVar10 = &a_node->m_branch[0].field_1;
          uVar8 = 0;
          while( true ) {
            bVar4 = uVar9 == uVar8;
            if (bVar4) {
              return bVar4;
            }
            if ((((uVar6 & 0xffffffff) != uVar8) && (r[uVar8] <= a_sphere->m_radius)) &&
               (bVar5 = SearchHelper(paVar10->m_child,a_sphere,a_result), !bVar5)) break;
            uVar8 = uVar8 + 1;
            paVar10 = paVar10 + 7;
          }
          return bVar4;
        }
      }
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, struct ON_RTreeSphere* a_sphere, ON_RTreeSearchResultCallback& a_result ) 
{
  // NOTE: 
  //  Some versions of ON_RTree::Search shrink a_sphere as the search progresses.
  int i, closest_i, count;
  const double* sphere_center;
  const ON_RTreeBranch* branch;
  double r[ON_RTree_MAX_NODE_COUNT], sphere_radius, closest_d;
  
  if ( (count = a_node->m_count) > 0 )
  {
    branch = a_node->m_branch;
    sphere_center = a_sphere->m_point;
    sphere_radius = a_sphere->m_radius;
    closest_i = -1;
    closest_d = sphere_radius;

    for( i = 0; i < count; ++i )
    {
      // The radius parameter passed to DistanceToBoxHelper()
      // needs to be sphere_radius and not closest_d in order 
      // for the for() loops below to work correctly.
      r[i] = DistanceToBoxHelper( sphere_center, sphere_radius, &branch[i].m_rect );
      if ( r[i] <= closest_d )
      {
        closest_d = r[i];
        closest_i = i;
      }
    }

    // If all of the branches rectangles do not intersect the sphere,
    // then closest_i = -1.
    if ( closest_i >= 0 )
    {
      if(a_node->IsInternalNode()) 
      {
        // a_node is an internal node - search m_branch[].m_child as needed.
        // Search a closer node first to avoid worst case search times
        // in calculations where the calls to a_result.m_resultCallback()
        // reduce a_sphere->m_radius as results are found.  Closest point
        // calculations are an example.
        if ( !SearchHelper(branch[closest_i].m_child, a_sphere, a_result) )
        {
          // callback canceled search
          return false;
        }

        for( i = 0; i < count; ++i )
        {
          // Note that the calls to SearchHelper() can reduce the
          // value of a_sphere->m_radius.
          if( i != closest_i && r[i] <= a_sphere->m_radius )
          {
            if(!SearchHelper(branch[i].m_child, a_sphere, a_result) )
            {
              return false; // Don't continue searching
            }
          }
        }
      }
      else
      {
        // a_node is a leaf node - return m_branch[].m_id values
        // Search a closer node first to avoid worst case search times
        // in calculations where the calls to a_result.m_resultCallback()
        // reduce a_sphere->m_radius as results are found.  Closest point
        // calculations are an example.
        if ( !a_result.m_resultCallback( a_result.m_context, branch[closest_i].m_id ) ) 
        {
          // callback canceled search
          return false;
        }

        for( i = 0; i < count; ++i)
        {
          // Note that the calls to a_result.m_resultCallback() can reduce
          // the value of a_sphere->m_radius.
          if( i != closest_i && r[i] <= a_sphere->m_radius )
          {
            if ( !a_result.m_resultCallback( a_result.m_context, branch[i].m_id ) )
            {
              // callback canceled search
              return false;
            }
          }
        }
      }
    }
  }

  return true; // Continue searching
}